

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outchars.c
# Opt level: O0

void free_drawing_info(curses_drawing_info *di)

{
  curses_drawing_info *di_local;
  
  free_symarray(di->bgelements,di->num_bgelements);
  free_symarray(di->traps,di->num_traps);
  free_symarray(di->objects,di->num_objects);
  free_symarray(di->monsters,di->num_monsters);
  free_symarray(di->warnings,di->num_warnings);
  free_symarray(di->invis,L'\x01');
  free_symarray(di->effects,di->num_effects);
  free_symarray(di->expltypes,di->num_expltypes);
  free_symarray(di->explsyms,L'\t');
  free_symarray(di->zaptypes,di->num_zaptypes);
  free_symarray(di->zapsyms,L'\x04');
  free_symarray(di->breathsyms,L'\x04');
  free_symarray(di->swallowsyms,L'\b');
  free(di);
  return;
}

Assistant:

static void free_drawing_info(struct curses_drawing_info *di)
{
    free_symarray(di->bgelements, di->num_bgelements);
    free_symarray(di->traps, di->num_traps);
    free_symarray(di->objects, di->num_objects);
    free_symarray(di->monsters, di->num_monsters);
    free_symarray(di->warnings, di->num_warnings);
    free_symarray(di->invis, 1);
    free_symarray(di->effects, di->num_effects);
    free_symarray(di->expltypes, di->num_expltypes);
    free_symarray(di->explsyms, NUMEXPCHARS);
    free_symarray(di->zaptypes, di->num_zaptypes);
    free_symarray(di->zapsyms, NUMZAPCHARS);
    free_symarray(di->breathsyms, NUMBREATHCHARS);
    free_symarray(di->swallowsyms, NUMSWALLOWCHARS);
    
    free(di);
}